

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlobIOSystem.h
# Opt level: O0

IOStream * __thiscall Assimp::BlobIOSystem::Open(BlobIOSystem *this,char *pFile,char *pMode)

{
  char *pcVar1;
  BlobIOSystem *this_00;
  value_type *__x;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar2;
  allocator local_91;
  string local_90;
  _Base_ptr local_70;
  undefined1 local_68;
  allocator local_49;
  value_type local_48;
  char *local_28;
  char *pMode_local;
  char *pFile_local;
  BlobIOSystem *this_local;
  
  if (*pMode == 'w') {
    local_28 = pMode;
    pMode_local = pFile;
    pFile_local = (char *)this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_48,pFile,&local_49);
    __x = &local_48;
    pVar2 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->created,__x);
    local_70 = (_Base_ptr)pVar2.first._M_node;
    local_68 = pVar2.second;
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    this_00 = (BlobIOSystem *)
              Intern::AllocateFromAssimpHeap::operator_new
                        ((AllocateFromAssimpHeap *)0x58,(size_t)__x);
    pcVar1 = pMode_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_90,pcVar1,&local_91);
    BlobIOStream::BlobIOStream((BlobIOStream *)this_00,this,&local_90,0x1000);
    this_local = this_00;
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
  }
  else {
    this_local = (BlobIOSystem *)0x0;
  }
  return (IOStream *)this_local;
}

Assistant:

virtual IOStream* Open(const char* pFile,
        const char* pMode)
    {
        if (pMode[0] != 'w') {
            return NULL;
        }

        created.insert(std::string(pFile));
        return new BlobIOStream(this,std::string(pFile));
    }